

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget)

{
  cmLocalGenerator *lg;
  string_view view;
  cmGeneratorTarget *this_00;
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  pointer this_01;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  string err;
  cmAlphaNum local_370;
  string local_340;
  shared_ptr<cmQtAutoGen::CompilerFeatures> local_320;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  string local_2c0;
  cmGeneratorTarget *local_2a0;
  cmGeneratorTarget *genTarget;
  undefined8 local_268;
  size_t sStack_260;
  cmAlphaNum local_258;
  undefined1 local_228 [8];
  string targetName;
  size_t local_200;
  undefined1 local_1f8 [16];
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  undefined1 auStack_1d8 [8];
  string_view prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  allocator<char> local_169;
  string local_168;
  string local_148 [32];
  undefined1 local_128 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_110 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  string *val;
  size_t local_a8;
  char *pcStack_a0;
  cmAlphaNum local_90;
  undefined1 local_60 [8];
  string prop;
  anon_class_16_2_c95d1c49 print_err;
  bool ignoreMissingTarget_local;
  string *executable_local;
  GenVarsT *genVars_local;
  cmQtAutoGenInitializer *this_local;
  
  local_a8 = (genVars->GenNameUpper)._M_len;
  pcStack_a0 = (genVars->GenNameUpper)._M_str;
  prop.field_2._8_8_ = this;
  cmAlphaNum::cmAlphaNum(&local_90,genVars->GenNameUpper);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&val,"_EXECUTABLE");
  cmStrCat<>((string *)local_60,&local_90,(cmAlphaNum *)&val);
  psVar2 = cmTarget::GetSafeProperty(this->GenTarget->Target,(string *)local_60);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmMakefile::GetBacktrace
              ((cmMakefile *)
               &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)&cge,
               (cmListFileBacktrace *)
               &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_110,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    std::__cxx11::string::string(local_148,(string *)psVar2);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_128,(string *)local_110);
    std::__cxx11::string::~string(local_148);
    this_01 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)local_128);
    lg = this->LocalGen;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
    std::__cxx11::string::string((string *)&local_190);
    psVar2 = cmCompiledGeneratorExpression::Evaluate
                       (this_01,lg,&local_168,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_190);
    std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)psVar2);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_128);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_110);
    cmListFileBacktrace::~cmListFileBacktrace
              ((cmListFileBacktrace *)
               &ge.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) || (ignoreMissingTarget)) {
      std::make_shared<cmQtAutoGen::CompilerFeatures>();
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                (&genVars->ExecutableFeatures,
                 (shared_ptr<cmQtAutoGen::CompilerFeatures> *)&prefix._M_str);
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr
                ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)&prefix._M_str);
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      std::operator+(&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     " evaluates to an empty value");
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      this_local._7_1_ = 0;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)local_60);
  if (!bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_1d8);
    if ((this->QtVersion).Major == 4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,"Qt4::");
      auStack_1d8 = (undefined1  [8])local_1e8._M_len;
      prefix._M_len = (size_t)local_1e8._M_str;
    }
    else if ((this->QtVersion).Major == 5) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_1f8,"Qt5::");
      auStack_1d8 = (undefined1  [8])local_1f8._0_8_;
      prefix._M_len = local_1f8._8_8_;
    }
    else if ((this->QtVersion).Major == 6) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)((long)&targetName.field_2 + 8)
                 ,"Qt6::");
      auStack_1d8 = (undefined1  [8])targetName.field_2._8_8_;
      prefix._M_len = local_200;
    }
    local_268 = auStack_1d8;
    sStack_260 = prefix._M_len;
    view._M_str = (char *)prefix._M_len;
    view._M_len = (size_t)auStack_1d8;
    cmAlphaNum::cmAlphaNum(&local_258,view);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&genTarget,executable);
    cmStrCat<>((string *)local_228,&local_258,(cmAlphaNum *)&genTarget);
    local_2a0 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGen,(string *)local_228);
    if (local_2a0 == (cmGeneratorTarget *)0x0) {
      if (ignoreMissingTarget) {
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                  (&genVars->ExecutableFeatures,&local_320);
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr(&local_320);
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_370,"Could not find ");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&err.field_2 + 8),executable);
        cmStrCat<char[20],std::__cxx11::string>
                  (&local_340,&local_370,(cmAlphaNum *)((long)&err.field_2 + 8),
                   (char (*) [20])" executable target ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),&local_340);
        std::__cxx11::string::~string((string *)&local_340);
        this_local._7_1_ = 0;
        bVar1 = true;
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&genVars->ExecutableTargetName,(string *)local_228);
      genVars->ExecutableTarget = local_2a0;
      bVar1 = cmGeneratorTarget::IsImported(local_2a0);
      this_00 = local_2a0;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"",&local_2e1);
        cmGeneratorTarget::ImportedGetLocation(&local_2c0,this_00,&local_2e0);
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator(&local_2e1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"",&local_309);
        psVar2 = cmGeneratorTarget::GetLocation(this_00,&local_308);
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)psVar2);
        std::__cxx11::string::~string((string *)&local_308);
        std::allocator<char>::~allocator(&local_309);
      }
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_228);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_3c0);
      cmQtAutoGenGlobalInitializer::GetCompilerFeatures
                ((cmQtAutoGenGlobalInitializer *)local_3d0,(string *)this->GlobalInitializer,
                 executable,&genVars->Executable);
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                (&genVars->ExecutableFeatures,(shared_ptr<cmQtAutoGen::CompilerFeatures> *)local_3d0
                );
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr
                ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)local_3d0);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&genVars->ExecutableFeatures)
      ;
      if (!bVar1) {
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)((long)&prop.field_2 + 8),(string *)local_3c0);
        this_local._7_1_ = 0;
      }
      std::__cxx11::string::~string((string *)local_3c0);
      if (bVar1) {
        this_local._7_1_ = 1;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    cmSystemTools::Error(cmStrCat(genVars.GenNameUpper, " for target ",
                                  this->GenTarget->GetName(), ": ", err));
  };

  // Custom executable
  {
    std::string const prop = cmStrCat(genVars.GenNameUpper, "_EXECUTABLE");
    std::string const& val = this->GenTarget->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable = cge->Evaluate(this->LocalGen, "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Create empty compiler features.
      genVars.ExecutableFeatures =
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    cm::string_view prefix;
    if (this->QtVersion.Major == 4) {
      prefix = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      prefix = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      prefix = "Qt6::";
    }
    std::string const targetName = cmStrCat(prefix, executable);

    // Find target
    cmGeneratorTarget* genTarget =
      this->LocalGen->FindGeneratorTargetToUse(targetName);
    if (genTarget) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = genTarget;
      if (genTarget->IsImported()) {
        genVars.Executable = genTarget->ImportedGetLocation("");
      } else {
        genVars.Executable = genTarget->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        // Create empty compiler features.
        genVars.ExecutableFeatures =
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
        return true;
      }
      print_err(cmStrCat("Could not find ", executable, " executable target ",
                         targetName));
      return false;
    }
  }

  // Get executable features
  {
    std::string err;
    genVars.ExecutableFeatures = this->GlobalInitializer->GetCompilerFeatures(
      executable, genVars.Executable, err);
    if (!genVars.ExecutableFeatures) {
      print_err(err);
      return false;
    }
  }

  return true;
}